

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

int StateGetHandSize(pyhanabi_state_t *state,int pid)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x19d,"int StateGetHandSize(pyhanabi_state_t *, int)");
  }
  uVar3 = (ulong)pid;
  lVar1 = *(long *)((long)state->state + 0x40);
  uVar2 = (*(long *)((long)state->state + 0x48) - lVar1 >> 4) * -0x5555555555555555;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    return (int)((ulong)(*(long *)(lVar1 + 8 + uVar3 * 0x30) - *(long *)(lVar1 + uVar3 * 0x30)) >> 3
                );
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

int StateGetHandSize(pyhanabi_state_t* state, int pid) {
  REQUIRE(state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->Hands()
      .at(pid)
      .Cards()
      .size();
}